

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O0

int SharpYuvOptionsInitInternal
              (SharpYuvConversionMatrix *yuv_matrix,SharpYuvOptions *options,int version)

{
  int minor;
  int major;
  int version_local;
  SharpYuvOptions *options_local;
  SharpYuvConversionMatrix *yuv_matrix_local;
  int local_4;
  
  if ((((options == (SharpYuvOptions *)0x0) || (yuv_matrix == (SharpYuvConversionMatrix *)0x0)) ||
      ((version >> 0x18 == 0 && ((version >> 0x10 & 0xffU) != 4)))) || (version >> 0x18 != 0)) {
    local_4 = 0;
  }
  else {
    options->yuv_matrix = yuv_matrix;
    options->transfer_type = kSharpYuvTransferFunctionSrgb;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int SharpYuvOptionsInitInternal(const SharpYuvConversionMatrix* yuv_matrix,
                                SharpYuvOptions* options, int version) {
  const int major = (version >> 24);
  const int minor = (version >> 16) & 0xff;
  if (options == NULL || yuv_matrix == NULL ||
      (major == SHARPYUV_VERSION_MAJOR && major == 0 &&
       minor != SHARPYUV_VERSION_MINOR) ||
      (major != SHARPYUV_VERSION_MAJOR)) {
    return 0;
  }
  options->yuv_matrix = yuv_matrix;
  options->transfer_type = kSharpYuvTransferFunctionSrgb;
  return 1;
}